

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_send_http_ok(mg_connection *conn,char *mime_type,longlong content_length)

{
  int local_4c;
  char local_48 [4];
  int trunc;
  char len [32];
  longlong content_length_local;
  char *mime_type_local;
  mg_connection *conn_local;
  
  if ((mime_type == (char *)0x0) || (content_length_local = (longlong)mime_type, *mime_type == '\0')
     ) {
    content_length_local = (longlong)anon_var_dwarf_1d647;
  }
  mg_response_header_start(conn,200);
  send_no_cache_header(conn);
  send_additional_header(conn);
  send_cors_header(conn);
  mg_response_header_add(conn,"Content-Type",(char *)content_length_local,-1);
  if (content_length < 0) {
    if (conn->protocol_type == 0) {
      mg_response_header_add(conn,"Transfer-Encoding","chunked",-1);
    }
  }
  else {
    local_4c = 0;
    mg_snprintf(conn,&local_4c,local_48,0x20,"%lu",content_length);
    if (local_4c == 0) {
      mg_response_header_add(conn,"Content-Length",local_48,-1);
    }
  }
  mg_response_header_send(conn);
  return 0;
}

Assistant:

CIVETWEB_API int
mg_send_http_ok(struct mg_connection *conn,
                const char *mime_type,
                long long content_length)
{
	if ((mime_type == NULL) || (*mime_type == 0)) {
		/* No content type defined: default to text/html */
		mime_type = "text/html";
	}

	mg_response_header_start(conn, 200);
	send_no_cache_header(conn);
	send_additional_header(conn);
	send_cors_header(conn);
	mg_response_header_add(conn, "Content-Type", mime_type, -1);
	if (content_length < 0) {
		/* Size not known. Use chunked encoding (HTTP/1.x) */
		if (conn->protocol_type == PROTOCOL_TYPE_HTTP1) {
			/* Only HTTP/1.x defines "chunked" encoding, HTTP/2 does not*/
			mg_response_header_add(conn, "Transfer-Encoding", "chunked", -1);
		}
	} else {
		char len[32];
		int trunc = 0;
		mg_snprintf(conn,
		            &trunc,
		            len,
		            sizeof(len),
		            "%" UINT64_FMT,
		            (uint64_t)content_length);
		if (!trunc) {
			/* Since 32 bytes is enough to hold any 64 bit decimal number,
			 * !trunc is always true */
			mg_response_header_add(conn, "Content-Length", len, -1);
		}
	}
	mg_response_header_send(conn);

	return 0;
}